

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O2

void __thiscall solution::clear(solution *this)

{
  pointer pbVar1;
  bucket *b;
  pointer pbVar2;
  vector<bucket,_std::allocator<bucket>_> *__range1;
  
  pbVar1 = (this->buckets).super__Vector_base<bucket,_std::allocator<bucket>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->buckets).super__Vector_base<bucket,_std::allocator<bucket>_>._M_impl.
                super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    pbVar2->used = 0;
  }
  std::deque<step,_std::allocator<step>_>::clear(&this->current_steps);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->steps_ixes);
  this->not_found_reason = (char *)0x0;
  this->measure = 0;
  this->wastage = 0;
  return;
}

Assistant:

void solution::clear()
{
	for (bucket& b : buckets)
		b.used = 0;
	current_steps.clear();
	steps_ixes.clear();
	not_found_reason = nullptr;
	measure = 0;
	wastage = 0;
}